

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

void __thiscall
testing::internal::ReturnAction<ot::commissioner::Error>::
Impl<ot::commissioner::Error,_ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
::Impl(Impl<ot::commissioner::Error,_ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
       *this,shared_ptr<ot::commissioner::Error> *value)

{
  undefined1 auStack_38 [40];
  
  (this->
  super_ActionInterface<ot::commissioner::Error_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&)>
  )._vptr_ActionInterface = (_func_int **)&PTR__Impl_00343d88;
  ot::commissioner::Error::Error
            (&this->value_before_cast_,
             (value->super___shared_ptr<ot::commissioner::Error,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            );
  ot::commissioner::Error::Error((Error *)auStack_38,&this->value_before_cast_);
  ot::commissioner::Error::Error(&this->value_,(Error *)auStack_38);
  std::__cxx11::string::~string((string *)(auStack_38 + 8));
  return;
}

Assistant:

explicit Impl(const std::shared_ptr<R>& value)
        : value_before_cast_(*value),
          value_(ImplicitCast_<Result>(value_before_cast_)) {}